

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Rotate.h
# Opt level: O0

void Gs::Details::FreeRotation<Gs::Matrix<float,4ul,4ul>,float>
               (Matrix<float,_4UL,_4UL> *mat,Vector3T<float> *axis,float *angle)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  double dVar10;
  float *z;
  float *y;
  float *x;
  float cc;
  float s;
  float c;
  float *angle_local;
  Vector3T<float> *axis_local;
  Matrix<float,_4UL,_4UL> *mat_local;
  
  dVar10 = std::cos((double)(ulong)(uint)*angle);
  fVar7 = SUB84(dVar10,0);
  dVar10 = std::sin((double)(ulong)(uint)*angle);
  fVar8 = SUB84(dVar10,0);
  fVar9 = 1.0 - fVar7;
  pfVar6 = &axis->y;
  pfVar4 = &axis->z;
  fVar1 = axis->x;
  fVar2 = axis->x;
  pfVar5 = Matrix<float,_4UL,_4UL>::At(mat,0,0);
  *pfVar5 = fVar1 * fVar2 * fVar9 + fVar7;
  fVar1 = axis->x;
  fVar2 = *pfVar6;
  fVar3 = *pfVar4;
  pfVar5 = Matrix<float,_4UL,_4UL>::At(mat,1,0);
  *pfVar5 = fVar1 * fVar2 * fVar9 + -(fVar3 * fVar8);
  fVar1 = axis->x;
  fVar2 = *pfVar4;
  fVar3 = *pfVar6;
  pfVar5 = Matrix<float,_4UL,_4UL>::At(mat,2,0);
  *pfVar5 = fVar1 * fVar2 * fVar9 + fVar3 * fVar8;
  fVar1 = *pfVar6;
  fVar2 = axis->x;
  fVar3 = *pfVar4;
  pfVar5 = Matrix<float,_4UL,_4UL>::At(mat,0,1);
  *pfVar5 = fVar1 * fVar2 * fVar9 + fVar3 * fVar8;
  fVar1 = *pfVar6;
  fVar2 = *pfVar6;
  pfVar5 = Matrix<float,_4UL,_4UL>::At(mat,1,1);
  *pfVar5 = fVar1 * fVar2 * fVar9 + fVar7;
  fVar1 = *pfVar6;
  fVar2 = *pfVar4;
  fVar3 = axis->x;
  pfVar5 = Matrix<float,_4UL,_4UL>::At(mat,2,1);
  *pfVar5 = fVar1 * fVar2 * fVar9 + -(fVar3 * fVar8);
  fVar1 = axis->x;
  fVar2 = *pfVar4;
  fVar3 = *pfVar6;
  pfVar5 = Matrix<float,_4UL,_4UL>::At(mat,0,2);
  *pfVar5 = fVar1 * fVar2 * fVar9 + -(fVar3 * fVar8);
  fVar1 = *pfVar6;
  fVar2 = *pfVar4;
  fVar3 = axis->x;
  pfVar6 = Matrix<float,_4UL,_4UL>::At(mat,1,2);
  *pfVar6 = fVar1 * fVar2 * fVar9 + fVar3 * fVar8;
  fVar1 = *pfVar4;
  fVar2 = *pfVar4;
  pfVar6 = Matrix<float,_4UL,_4UL>::At(mat,2,2);
  *pfVar6 = fVar1 * fVar2 * fVar9 + fVar7;
  return;
}

Assistant:

void FreeRotation(M& mat, const Vector3T<T>& axis, const T& angle)
{
    GS_ASSERT_MxN_MATRIX("free rotation", M, 3, 3);

    /* Setup rotation values */
    const T  c  = std::cos(angle);
    const T  s  = std::sin(angle);
    const T  cc = T(1) - c;

    const T& x  = axis.x;
    const T& y  = axis.y;
    const T& z  = axis.z;

    /* Perform matrix rotation */
    mat.At(0, 0) = x*x*cc + c;
    mat.At(1, 0) = x*y*cc - z*s;
    mat.At(2, 0) = x*z*cc + y*s;

    mat.At(0, 1) = y*x*cc + z*s;
    mat.At(1, 1) = y*y*cc + c;
    mat.At(2, 1) = y*z*cc - x*s;

    mat.At(0, 2) = x*z*cc - y*s;
    mat.At(1, 2) = y*z*cc + x*s;
    mat.At(2, 2) = z*z*cc + c;
}